

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParseReserved
          (Parser *this,EnumDescriptorProto *proto,LocationRecorder *enum_location)

{
  TokenType TVar1;
  bool bVar2;
  char *pcVar3;
  string_view text;
  ErrorMaker error;
  LocationRecorder location;
  Token start_token;
  
  io::Tokenizer::Token::Token(&start_token,&this->input_->current_);
  text._M_str = "reserved";
  text._M_len = 8;
  bVar2 = Consume(this,text);
  if (!bVar2) {
    bVar2 = false;
    goto LAB_001bf092;
  }
  TVar1 = (this->input_->current_).type;
  if (TVar1 == TYPE_IDENTIFIER) {
    bVar2 = std::operator!=(&this->syntax_identifier_,"editions");
    if (bVar2) {
      pcVar3 = "Reserved names must be string literals. (Only editions supports identifiers.)";
LAB_001beff6:
      bVar2 = false;
      error.func_ = (_func_string_void_ptr *)0x0;
      error.field_0.error_ = pcVar3;
      RecordError(this,error);
      goto LAB_001bf092;
    }
    LocationRecorder::LocationRecorder(&location,enum_location,5);
    LocationRecorder::StartAt(&location,&start_token);
    bVar2 = ParseReservedIdentifiers(this,proto,&location);
  }
  else if (TVar1 == TYPE_STRING) {
    bVar2 = std::operator==(&this->syntax_identifier_,"editions");
    if (bVar2) {
      pcVar3 = "Reserved names must be identifiers in editions, not string literals.";
      goto LAB_001beff6;
    }
    LocationRecorder::LocationRecorder(&location,enum_location,5);
    LocationRecorder::StartAt(&location,&start_token);
    bVar2 = ParseReservedNames(this,proto,&location);
  }
  else {
    LocationRecorder::LocationRecorder(&location,enum_location,4);
    LocationRecorder::StartAt(&location,&start_token);
    bVar2 = ParseReservedNumbers(this,proto,&location);
  }
  LocationRecorder::~LocationRecorder(&location);
LAB_001bf092:
  std::__cxx11::string::~string((string *)&start_token.text);
  return bVar2;
}

Assistant:

bool Parser::ParseReserved(EnumDescriptorProto* proto,
                           const LocationRecorder& enum_location) {
  io::Tokenizer::Token start_token = input_->current();
  // Parse the declaration.
  DO(Consume("reserved"));
  if (LookingAtType(io::Tokenizer::TYPE_STRING)) {
    if (syntax_identifier_ == "editions") {
      RecordError(
          "Reserved names must be identifiers in editions, not string "
          "literals.");
      return false;
    }
    LocationRecorder location(enum_location,
                              EnumDescriptorProto::kReservedNameFieldNumber);
    location.StartAt(start_token);
    return ParseReservedNames(proto, location);
  } else if (LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
    if (syntax_identifier_ != "editions") {
      RecordError(
          "Reserved names must be string literals. (Only editions supports "
          "identifiers.)");
      return false;
    }
    LocationRecorder location(enum_location,
                              EnumDescriptorProto::kReservedNameFieldNumber);
    location.StartAt(start_token);
    return ParseReservedIdentifiers(proto, location);
  } else {
    LocationRecorder location(enum_location,
                              EnumDescriptorProto::kReservedRangeFieldNumber);
    location.StartAt(start_token);
    return ParseReservedNumbers(proto, location);
  }
}